

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# electron_optimisation_algorithm.cpp
# Opt level: O0

ElnDist * __thiscall
indigox::algorithm::ElectronOptimisationAlgorithm::CalculateUpperLimit
          (ElectronOptimisationAlgorithm *this)

{
  unsigned_long uVar1;
  bool bVar2;
  Score SVar3;
  value_type_conflict1 *pvVar4;
  size_type sVar5;
  reference puVar6;
  const_iterator in_RSI;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  Score tmp;
  size_t i_1;
  iterator __end2;
  iterator __begin2;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *__range2;
  size_t mPos;
  Score cMin;
  size_t i;
  const_iterator it;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> all_pos;
  ElnDist *initDist;
  undefined4 in_stack_fffffffffffffed8;
  Score in_stack_fffffffffffffedc;
  iterator in_stack_fffffffffffffee0;
  value_type_conflict1 *__x;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  ElnDist *in_stack_ffffffffffffff08;
  ElectronOptimisationAlgorithm *in_stack_ffffffffffffff10;
  _Self local_a8;
  _Self local_a0;
  undefined1 *local_98;
  _Base_ptr local_90;
  unsigned_long local_88;
  Score local_7c;
  _Base_ptr local_78;
  _Base_ptr local_70;
  value_type_conflict1 *local_68;
  _Base_ptr local_60;
  undefined1 local_58 [71];
  byte local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffee0._M_node,
             (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset(this_00);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             0x155cfb);
  local_60 = (_Base_ptr)
             std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
             begin((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  local_68 = (value_type_conflict1 *)0x0;
  while (__x = local_68,
        pvVar4 = (value_type_conflict1 *)
                 boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDI),
        __x < pvVar4) {
    local_78 = local_60;
    in_stack_fffffffffffffee0 =
         std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
                   ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                    this_00,in_RSI,__x);
    local_68 = (value_type_conflict1 *)((long)local_68 + 1);
    local_70 = in_stack_fffffffffffffee0._M_node;
    local_60 = in_stack_fffffffffffffee0._M_node;
  }
  while (sVar5 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count
                           (this_00), sVar5 < (in_RSI._M_node)->_M_parent->_M_color) {
    local_7c = Options::AssignElectrons::INF;
    local_90 = (_Base_ptr)
               std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
               begin((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *
                     )CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    puVar6 = std::_Rb_tree_const_iterator<unsigned_long>::operator*
                       ((_Rb_tree_const_iterator<unsigned_long> *)0x155e32);
    local_88 = *puVar6;
    local_98 = local_58;
    local_a0._M_node =
         (_Base_ptr)
         std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::begin
                   ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                    CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    local_a8._M_node =
         (_Base_ptr)
         std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                   ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                    CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    while (bVar2 = std::operator!=(&local_a0,&local_a8), bVar2) {
      puVar6 = std::_Rb_tree_const_iterator<unsigned_long>::operator*
                         ((_Rb_tree_const_iterator<unsigned_long> *)0x155ea2);
      uVar1 = *puVar6;
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                (this_00,(size_type)__x,SUB81((ulong)in_stack_fffffffffffffee0._M_node >> 0x38,0));
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffffee0._M_node,
                 (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      in_stack_fffffffffffffedc =
           CalculateDistributionEnergy(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x155ef0);
      if (in_stack_fffffffffffffedc < local_7c) {
        local_88 = uVar1;
        local_7c = in_stack_fffffffffffffedc;
      }
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset
                (this_00,(size_type)__x);
      std::_Rb_tree_const_iterator<unsigned_long>::operator++
                ((_Rb_tree_const_iterator<unsigned_long> *)in_stack_fffffffffffffee0._M_node);
    }
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
              (this_00,(size_type)__x,SUB81((ulong)in_stack_fffffffffffffee0._M_node >> 0x38,0));
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::erase
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffee0._M_node,
               (key_type *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  }
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffee0._M_node,
             (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  SVar3 = CalculateDistributionEnergy(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  *(Score *)((long)&in_RSI._M_node[2]._M_right + 4) = SVar3;
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x155fd6);
  if (*(uint *)((long)&in_RSI._M_node[2]._M_right + 4) < Options::AssignElectrons::INF) {
    *(int *)((long)&in_RSI._M_node[2]._M_right + 4) =
         *(int *)((long)&in_RSI._M_node[2]._M_right + 4) + 1;
  }
  local_11 = 1;
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             0x15602e);
  if ((local_11 & 1) == 0) {
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x156053);
  }
  return this_00;
}

Assistant:

ElnDist ElectronOptimisationAlgorithm::CalculateUpperLimit() {
//  bool tmp_allow_charged_carbon = opt_::ALLOW_CHARGED_CARBON;
//  opt_::ALLOW_CHARGED_CARBON = true;
//  uint32_t tmp_high_charge = opt_::HIGHEST_MAGNITUDE_CHARGE;
//  opt_::HIGHEST_MAGNITUDE_CHARGE = 0;
  
  ElnDist initDist = ElnDist(previousDist_);
  initDist.reset();
  std::set<size_t> all_pos;
  std::set<size_t>::const_iterator it = all_pos.begin();
  for (size_t i = 0; i < initDist.size(); ++i) it = all_pos.insert(it, i);
  
  while (initDist.count() < parent_->electronsToAdd_) {
    Score cMin = opt_::INF;
    size_t mPos = *(all_pos.begin());
    for (size_t i : all_pos) {
      initDist.set(i);
      Score tmp = CalculateDistributionEnergy(initDist);
      if (tmp < cMin) {
        cMin = tmp;
        mPos = i;
      }
      initDist.reset(i);
    }
    initDist.set(mPos);
    all_pos.erase(mPos);
  }
  upperLimit_ = CalculateDistributionEnergy(initDist);
  
//  opt_::ALLOW_CHARGED_CARBON = tmp_allow_charged_carbon;
//  opt_::HIGHEST_MAGNITUDE_CHARGE = tmp_high_charge;
  
  if (upperLimit_ < opt_::INF) ++upperLimit_;
  return initDist;
}